

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

int miniros::names::init(EVP_PKEY_CTX *ctx)

{
  _Rb_tree_node_base *__lhs;
  bool bVar1;
  _Rb_tree_node_base *in_RAX;
  string *__rhs;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  string resolved_right;
  string resolved_left;
  string local_70;
  string local_50;
  
  p_Var3 = *(_Rb_tree_node_base **)(ctx + 0x18);
  while (p_Var3 != (_Rb_tree_node_base *)(ctx + 8)) {
    if ((p_Var3[1]._M_parent != (_Base_ptr)0x0) && (__lhs = p_Var3 + 1, **(char **)__lhs != '_')) {
      __rhs = this_node::getName_abi_cxx11_();
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,__rhs);
      if (bVar1) {
        resolve(&local_50,(string *)__lhs,false);
        resolve(&local_70,(string *)(p_Var3 + 2),false);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)g_remappings_abi_cxx11_,&local_50);
        std::__cxx11::string::_M_assign((string *)pmVar2);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)g_unresolved_remappings_abi_cxx11_,(key_type *)__lhs);
        std::__cxx11::string::_M_assign((string *)pmVar2);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    p_Var3 = in_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void init(const M_string& remappings)
{
  for (const auto& [left, right] : remappings)
  {
    if (!left.empty() && left[0] != '_' && left != this_node::getName())
    {
      std::string resolved_left = resolve(left, false);
      std::string resolved_right = resolve(right, false);
      g_remappings[resolved_left] = resolved_right;
      g_unresolved_remappings[left] = right;
    }
  }
}